

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphBenchmark.cpp
# Opt level: O0

void __thiscall
RandomGraphBenchmark::run(RandomGraphBenchmark *this,unsigned_long deletions,unsigned_long queries)

{
  edges_size_type eVar1;
  invalid_argument *this_00;
  ostream *poVar2;
  void *pvVar3;
  vertices_size_type vVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  unsigned_long queries_local;
  unsigned_long deletions_local;
  RandomGraphBenchmark *this_local;
  
  eVar1 = boost::
          num_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                    ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                      *)&(this->super_Benchmark).G);
  if (eVar1 < deletions) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"RandomGraphBenchmark: Too many deletions");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"[i] random graph initialization time: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
  dVar5 = Benchmark::getInitTime(&this->super_Benchmark);
  std::ostream::operator<<(pvVar3,dVar5);
  poVar2 = std::operator<<((ostream *)&std::cout," seconds (");
  vVar4 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                      *)&(this->super_Benchmark).G);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,vVar4);
  poVar2 = std::operator<<(poVar2," vertices ");
  eVar1 = boost::
          num_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                    ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                      *)&(this->super_Benchmark).G);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
  poVar2 = std::operator<<(poVar2," edges)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[i] random graph deletion time: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
  (**(this->super_Benchmark)._vptr_Benchmark)(this,deletions);
  std::ostream::operator<<(pvVar3,extraout_XMM0_Qa);
  poVar2 = std::operator<<((ostream *)&std::cout," seconds (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,deletions);
  poVar2 = std::operator<<(poVar2," deletions)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"[i] random graph query time: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
  dVar5 = Benchmark::getQueryTime(&this->super_Benchmark,queries);
  std::ostream::operator<<(pvVar3,dVar5);
  poVar2 = std::operator<<((ostream *)&std::cout," seconds (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,queries);
  poVar2 = std::operator<<(poVar2," queries)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void RandomGraphBenchmark::run(unsigned long deletions, unsigned long queries)
{
    if (deletions > num_edges(G)) {
        throw std::invalid_argument("RandomGraphBenchmark: Too many deletions");
    }

    std::cout << "[i] random graph initialization time: " << std::fixed << this->getInitTime();
    std::cout << " seconds (" << num_vertices(G) << " vertices " << num_edges(G) << " edges)" << std::endl;
    std::cout << "[i] random graph deletion time: " << std::fixed << this->getDeletionsTime(deletions);
    std::cout << " seconds (" << deletions << " deletions)" << std::endl;
    std::cout << "[i] random graph query time: " << std::fixed << this->getQueryTime(queries);
    std::cout << " seconds (" << queries << " queries)" << std::endl;
}